

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

int __thiscall ser::OffsetTable::AddNewSavepoint(OffsetTable *this,Savepoint *savepoint,int sid)

{
  pointer pmVar1;
  pointer pmVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  SerializationException *pSVar6;
  int iVar7;
  SerializationException exception;
  ostringstream msg;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [24];
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  local_1a8 [7];
  
  iVar3 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error: savepoint ",0x11);
    Savepoint::ToString_abi_cxx11_((string *)local_1f0,savepoint);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f0,(long)local_1e8._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," is already registered in table ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"at position ",0xc);
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)poVar5,*(int *)&iVar3._M_node[3]._M_left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (local_1f0 != (undefined1  [8])local_1e0) {
      operator_delete((void *)local_1f0);
    }
    local_1e8._M_p = local_1e0 + 8;
    local_1f0 = (undefined1  [8])&PTR__SerializationException_0018e9e8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_1e8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    pSVar6 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar6,(SerializationException *)local_1f0);
    __cxa_throw(pSVar6,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  if ((-1 < sid) &&
     (((long)(this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
      (ulong)(uint)sid != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error: requested ID ",0x14);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,sid);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," for savepoint ",0xf);
    Savepoint::ToString_abi_cxx11_((string *)local_1f0,savepoint);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_1f0,(long)local_1e8._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", but",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," it would be registered with ID ",0x20);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (local_1f0 != (undefined1  [8])local_1e0) {
      operator_delete((void *)local_1f0);
    }
    local_1e8._M_p = local_1e0 + 8;
    local_1f0 = (undefined1  [8])&PTR__SerializationException_0018e9e8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_1e8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    pSVar6 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar6,(SerializationException *)local_1f0);
    __cxa_throw(pSVar6,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  pmVar1 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::push_back
            (&this->savepoints_,savepoint);
  local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
  local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8[0]._M_impl._0_8_ = 0;
  local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>,std::allocator<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>>
  ::
  emplace_back<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>
            ((vector<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>,std::allocator<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>>
              *)&this->entries_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
              *)local_1a8);
  iVar7 = (int)((ulong)((long)pmVar2 - (long)pmVar1) >> 4) * -0x55555555;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  ::~_Rb_tree(local_1a8);
  pmVar4 = std::
           map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
           ::operator[](&this->savepointIndex_,savepoint);
  *pmVar4 = iVar7;
  return iVar7;
}

Assistant:

int OffsetTable::AddNewSavepoint(const Savepoint& savepoint, int sid)
{
    // Check that savepoint does not exist by looking at the index
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);

    if (iter != savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is already registered in table "
            << "at position " << iter->second << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check requested ID
    if (sid >= 0 && static_cast<unsigned>(sid) != entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: requested ID " << sid << " for savepoint " << savepoint.ToString() << ", but"
            << " it would be registered with ID " << entries_.size() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Register savepoint
    sid = entries_.size();
    savepoints_.push_back(savepoint);
    entries_.push_back(OffsetTableEntry());
    savepointIndex_[savepoint] = sid;
    return sid;
}